

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall jessilib::thread_pool::join(thread_pool *this)

{
  pointer ptVar1;
  vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_> *__range1;
  pointer ptVar2;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> uStack_38;
  
  std::mutex::lock(&this->m_threads_mutex);
  ptVar1 = (this->m_threads).
           super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->m_threads).
                super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::unique_lock<std::mutex>::unique_lock(&uStack_38,&ptVar2->m_notifier_mutex);
    ptVar2->m_shutdown = true;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
    std::condition_variable::notify_one();
  }
  ptVar1 = (this->m_threads).
           super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->m_threads).
                super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::clear
            (&this->m_threads);
  while ((this->m_inactive_threads).c.
         super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         (this->m_inactive_threads).c.
         super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>::
    pop_front(&(this->m_inactive_threads).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_threads_mutex);
  return;
}

Assistant:

void thread_pool::join() {
	std::lock_guard<std::mutex> guard(m_threads_mutex);

	// Shutdown threads
	for (thread& worker : m_threads) {
		// Mark thread for shutdown
		{
			std::unique_lock<std::mutex> guard(worker.m_notifier_mutex);
			worker.m_shutdown = true;
		}

		// Notify thread to shutdown
		worker.m_notifier.notify_one();
	}

	// Join threads
	for (thread& worker : m_threads) {
		worker.m_thread.join();
	}

	// Cleanup threads
	m_threads.clear();
	while (!m_inactive_threads.empty()) {
		m_inactive_threads.pop();
	}
}